

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_block<unsigned_char_*,_128U> *bucket,
          size_t depth)

{
  ushort uVar1;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *this_00;
  uchar *puVar2;
  vector_block<unsigned_char_*,_128U> *pvVar3;
  uint uVar4;
  uint index;
  uint j;
  long lVar5;
  uchar **t;
  size_t index_00;
  ulong uVar6;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  uchar *local_230 [64];
  
  this_00 = (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (*(int *)&(bucket->_index_block).
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(bucket->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x10 - bucket->_left_in_block;
  if ((uVar4 & 0xffffffc0) == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      lVar5 = 0;
      do {
        puVar2 = vector_block<unsigned_char_*,_128U>::operator[](bucket,lVar5 + uVar6);
        local_230[lVar5] = puVar2;
        if (puVar2 == (uchar *)0x0) goto LAB_001ad75b;
        if (puVar2[depth] == '\0') {
          uVar1 = 0;
        }
        else {
          uVar1 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        auStack_2b0[lVar5] = uVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      t = local_230;
      lVar5 = 0;
      do {
        pvVar3 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                           (this_00,(uint)auStack_2b0[lVar5]);
        if (pvVar3 == (vector_block<unsigned_char_*,_128U> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x78,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_block<unsigned char *, 128>]"
                       );
        }
        vector_block<unsigned_char_*,_128U>::push_back(pvVar3,t);
        lVar5 = lVar5 + 1;
        t = t + 1;
      } while (lVar5 != 0x40);
      uVar6 = uVar6 + 0x40;
    } while (uVar6 < (uVar4 & 0xffffffc0));
  }
  if ((uint)uVar6 < uVar4) {
    index_00 = uVar6 & 0xffffffff;
    do {
      local_230[0] = vector_block<unsigned_char_*,_128U>::operator[](bucket,index_00);
      if (local_230[0] == (uchar *)0x0) {
LAB_001ad75b:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (local_230[0][depth] == '\0') {
        index = 0;
      }
      else {
        index = (uint)CONCAT11(local_230[0][depth],local_230[0][depth + 1]);
      }
      pvVar3 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                         (this_00,index);
      if (pvVar3 == (vector_block<unsigned_char_*,_128U> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x80,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_block<unsigned char *, 128>]"
                     );
      }
      vector_block<unsigned_char_*,_128U>::push_back(pvVar3,local_230);
      index_00 = index_00 + 1;
    } while (index_00 < uVar4);
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}